

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

uint32_t ssl_get_hs_frag_off(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  return (uint)ssl->in_msg[6] << 0x10 | (uint)ssl->in_msg[7] << 8 | (uint)ssl->in_msg[8];
}

Assistant:

static uint32_t ssl_get_hs_frag_off(mbedtls_ssl_context const *ssl)
{
    return (ssl->in_msg[6] << 16) |
           (ssl->in_msg[7] << 8) |
           ssl->in_msg[8];
}